

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractbutton.cpp
# Opt level: O3

void __thiscall QAbstractButton::setText(QAbstractButton *this,QString *text)

{
  long lVar1;
  long lVar2;
  char cVar3;
  long in_FS_OFFSET;
  QStringView QVar4;
  QStringView QVar5;
  QKeySequence newMnemonic;
  undefined1 *local_58;
  code *local_50;
  undefined8 local_48;
  QAbstractButton *pQStack_40;
  undefined8 local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QWidget).field_0x8;
  lVar2 = *(long *)(lVar1 + 0x268);
  if (lVar2 == (text->d).size) {
    QVar4.m_data = *(storage_type_conflict **)(lVar1 + 0x260);
    QVar4.m_size = lVar2;
    QVar5.m_data = (text->d).ptr;
    QVar5.m_size = lVar2;
    cVar3 = QtPrivate::equalStrings(QVar4,QVar5);
    if (cVar3 != '\0') goto LAB_003be49e;
  }
  QString::operator=((QString *)(lVar1 + 600),(QString *)text);
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  QKeySequence::mnemonic((QString *)&local_58);
  setShortcut(this,(QKeySequence *)&local_58);
  *(undefined8 *)(lVar1 + 0x2ac) = 0xffffffffffffffff;
  QWidget::update(&this->super_QWidget);
  QWidget::updateGeometry(&this->super_QWidget);
  local_50 = QFont::strikeOut;
  local_48 = 0xaaaaaaaa0000800c;
  local_38 = 0xaaaaaaaaffffffff;
  pQStack_40 = this;
  QAccessible::updateAccessibility((QAccessibleEvent *)&local_50);
  QAccessibleEvent::~QAccessibleEvent((QAccessibleEvent *)&local_50);
  QKeySequence::~QKeySequence((QKeySequence *)&local_58);
LAB_003be49e:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractButton::setText(const QString &text)
{
    Q_D(QAbstractButton);
    if (d->text == text)
        return;
    d->text = text;
#ifndef QT_NO_SHORTCUT
    QKeySequence newMnemonic = QKeySequence::mnemonic(text);
    setShortcut(newMnemonic);
#endif
    d->sizeHint = QSize();
    update();
    updateGeometry();
#if QT_CONFIG(accessibility)
    QAccessibleEvent event(this, QAccessible::NameChanged);
    QAccessible::updateAccessibility(&event);
#endif
}